

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webclient.cpp
# Opt level: O1

response * __thiscall
warhawk::common::webclient::execute(response *__return_storage_ptr__,webclient *this,request *req_)

{
  cookie_list *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  void *pvVar3;
  response *prVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  _Base_ptr p_Var8;
  runtime_error *this_01;
  size_type *psVar9;
  webclient *pwVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  response *resp;
  curl_slist *info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  allocator<char> local_f9;
  string local_f8;
  response *local_d8;
  webclient *local_d0;
  long *local_c8;
  cookie local_c0;
  
  p_Var8 = (req_->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(req_->m_headers)._M_t._M_impl.super__Rb_tree_header;
  local_d8 = __return_storage_ptr__;
  local_d0 = this;
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    lVar7 = 0;
  }
  else {
    paVar2 = &local_c0.m_domain.field_2;
    lVar7 = 0;
    do {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,*(long *)(p_Var8 + 1),
                 (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
      std::__cxx11::string::append((char *)&local_f8);
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,*(ulong *)(p_Var8 + 2));
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_c0.m_domain.field_2._M_allocated_capacity = *psVar9;
        local_c0.m_domain.field_2._8_8_ = plVar6[3];
        local_c0.m_domain._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_c0.m_domain.field_2._M_allocated_capacity = *psVar9;
        local_c0.m_domain._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_c0.m_domain._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      lVar7 = curl_slist_append(lVar7,local_c0.m_domain._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_domain._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0.m_domain._M_dataplus._M_p,
                        local_c0.m_domain.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  pwVar10 = local_d0;
  curl_easy_setopt(local_d0->m_curl,0x2727,lVar7);
  p_Var8 = (req_->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(req_->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      pvVar3 = pwVar10->m_curl;
      cookie::to_string_abi_cxx11_(&local_c0.m_domain,(cookie *)(p_Var8 + 1));
      curl_easy_setopt(pvVar3,0x2797,local_c0.m_domain._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.m_domain._M_dataplus._M_p != &local_c0.m_domain.field_2) {
        operator_delete(local_c0.m_domain._M_dataplus._M_p,
                        local_c0.m_domain.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      pwVar10 = local_d0;
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  if ((req_->m_method)._M_string_length != 0) {
    curl_easy_setopt(pwVar10->m_curl,0x2734,(req_->m_method)._M_dataplus._M_p);
  }
  prVar4 = local_d8;
  if ((req_->m_data)._M_string_length != 0) {
    curl_easy_setopt(pwVar10->m_curl,0x3c);
    curl_easy_setopt(pwVar10->m_curl,0x271f,(req_->m_data)._M_dataplus._M_p);
  }
  curl_easy_setopt(pwVar10->m_curl,0x2712,(req_->m_url)._M_dataplus._M_p);
  curl_easy_setopt(pwVar10->m_curl,0x34,req_->m_follow_redirect);
  (prVar4->m_data)._M_dataplus._M_p = (pointer)&(prVar4->m_data).field_2;
  (prVar4->m_data)._M_string_length = 0;
  (prVar4->m_data).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(prVar4->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header;
  (prVar4->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (prVar4->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (prVar4->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (prVar4->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (prVar4->m_cookies).m_cookies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(prVar4->m_headers)._M_t._M_impl.super__Rb_tree_header;
  (prVar4->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (prVar4->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (prVar4->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (prVar4->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (prVar4->m_headers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  curl_easy_setopt(pwVar10->m_curl,0x4e2b,string_write_cb);
  curl_easy_setopt(pwVar10->m_curl,0x2711,prVar4);
  curl_easy_setopt(pwVar10->m_curl,0x4e6f,multimap_header_cb);
  curl_easy_setopt(pwVar10->m_curl,0x272d,&prVar4->m_headers);
  iVar5 = curl_easy_perform(pwVar10->m_curl);
  if (lVar7 != 0) {
    curl_slist_free_all(lVar7);
  }
  if (iVar5 != 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Failed to execute curl request:","");
    curl_easy_strerror(iVar5);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_c0.m_domain._M_dataplus._M_p = (pointer)*plVar6;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_c0.m_domain._M_dataplus._M_p == psVar9) {
      local_c0.m_domain.field_2._M_allocated_capacity = *psVar9;
      local_c0.m_domain.field_2._8_8_ = plVar6[3];
      local_c0.m_domain._M_dataplus._M_p = (pointer)&local_c0.m_domain.field_2;
    }
    else {
      local_c0.m_domain.field_2._M_allocated_capacity = *psVar9;
    }
    local_c0.m_domain._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(this_01,(string *)&local_c0);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  curl_easy_getinfo(pwVar10->m_curl,0x40001c,&local_c8);
  plVar6 = local_c8;
  if (local_c8 != (long *)0x0) {
    this_00 = &local_d8->m_cookies;
    do {
      if (*local_c8 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,(char *)*local_c8,&local_f9);
        cookie::parse(&local_c0,&local_f8);
        std::
        _Rb_tree<warhawk::common::cookie,_warhawk::common::cookie,_std::_Identity<warhawk::common::cookie>,_std::less<warhawk::common::cookie>,_std::allocator<warhawk::common::cookie>_>
        ::_M_insert_unique<warhawk::common::cookie>
                  ((_Rb_tree<warhawk::common::cookie,_warhawk::common::cookie,_std::_Identity<warhawk::common::cookie>,_std::less<warhawk::common::cookie>,_std::allocator<warhawk::common::cookie>_>
                    *)this_00,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_value._M_dataplus._M_p != &local_c0.m_value.field_2) {
          operator_delete(local_c0.m_value._M_dataplus._M_p,
                          local_c0.m_value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_name._M_dataplus._M_p != &local_c0.m_name.field_2) {
          operator_delete(local_c0.m_name._M_dataplus._M_p,
                          local_c0.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_path._M_dataplus._M_p != &local_c0.m_path.field_2) {
          operator_delete(local_c0.m_path._M_dataplus._M_p,
                          local_c0.m_path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.m_domain._M_dataplus._M_p != &local_c0.m_domain.field_2) {
          operator_delete(local_c0.m_domain._M_dataplus._M_p,
                          local_c0.m_domain.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      local_c8 = (long *)local_c8[1];
    } while (local_c8 != (long *)0x0);
  }
  prVar4 = local_d8;
  curl_easy_getinfo(local_d0->m_curl,0x200002,&local_d8->m_status_code);
  if (plVar6 != (long *)0x0) {
    curl_slist_free_all();
  }
  return prVar4;
}

Assistant:

response webclient::execute( const request &req_ )
{
  struct curl_slist* headers = nullptr;

  for ( auto &e : req_.m_headers )
  {
    auto str = e.first + ":" + e.second;
    headers = curl_slist_append( headers, str.c_str( ) );
  }

  curl_easy_setopt( m_curl, CURLOPT_HTTPHEADER, headers );

  for ( auto &c : req_.m_cookies.m_cookies )
  {
    curl_easy_setopt( m_curl, CURLOPT_COOKIELIST, c.to_string( ).c_str( ) );
  }

  if ( !req_.m_method.empty( ) )
  {
    curl_easy_setopt( m_curl, CURLOPT_CUSTOMREQUEST, req_.m_method.c_str( ) );
  }

  if ( !req_.m_data.empty( ) )
  {
    curl_easy_setopt( m_curl, CURLOPT_POSTFIELDSIZE, req_.m_data.size( ) );
    curl_easy_setopt( m_curl, CURLOPT_POSTFIELDS,    req_.m_data.data( ) );
  }

  curl_easy_setopt( m_curl, CURLOPT_URL,            req_.m_url.c_str( )            );
  curl_easy_setopt( m_curl, CURLOPT_FOLLOWLOCATION, req_.m_follow_redirect ? 1 : 0 );

  response resp;

  curl_easy_setopt( m_curl, CURLOPT_WRITEFUNCTION,  string_write_cb    );
  curl_easy_setopt( m_curl, CURLOPT_WRITEDATA,     &resp.m_data        );
  curl_easy_setopt( m_curl, CURLOPT_HEADERFUNCTION, multimap_header_cb );
  curl_easy_setopt( m_curl, CURLOPT_HEADERDATA,    &resp.m_headers     );

  auto res = curl_easy_perform( m_curl );

  if ( headers != NULL )
  {
    curl_slist_free_all( headers );
  }

  if ( res == CURLE_OK )
  {
    struct curl_slist *info;
    res = curl_easy_getinfo( m_curl, CURLINFO_COOKIELIST, &info );
    std::unique_ptr< struct curl_slist, decltype( &curl_slist_free_all ) > cleanup( info, &curl_slist_free_all );

    while ( info != nullptr )
    {
      if ( info->data != nullptr )
      {
        resp.m_cookies.m_cookies.insert( cookie::parse( info->data ) );
      }

      info = info->next;
    }

    curl_easy_getinfo( m_curl, CURLINFO_RESPONSE_CODE, &resp.m_status_code );

    return resp;
  }
  else
  {
    throw std::runtime_error( std::string( "Failed to execute curl request:" ) + curl_easy_strerror( res ) );
  }
}